

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value)

{
  ushort local_1c;
  ushort local_1a;
  KUINT16 j;
  KUINT16 i;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value_local;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  
  memcpy(__return_storage_ptr__,this,0x24);
  for (local_1a = 0; local_1a < 3; local_1a = local_1a + 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      __return_storage_ptr__->Data[local_1a][local_1c] =
           Value->Data[local_1a][local_1c] + __return_storage_ptr__->Data[local_1a][local_1c];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix operator + ( const Matrix & Value )
    {
        Matrix m = *this;
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                m.Data[i][j] += Value.Data[i][j];
            }
        }

        return m;
    }